

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O3

void __thiscall
wallmon::update_stats(wallmon *this,vector<int,_std::allocator<int>_> *pids,string read_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pid_t *ppVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  pair<int,_unsigned_long_long> pVar5;
  ifstream proc_uptime;
  string local_248;
  string local_228;
  byte abStack_208 [488];
  
  if ((this->got_mother_starttime == false) &&
     (ppVar2 = (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
     (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
     != ppVar2)) {
    pVar5 = get_mother_starttime(this,*ppVar2);
    paVar1 = &local_228.field_2;
    local_228._M_dataplus._M_p = (pointer)paVar1;
    if (pVar5.first != 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"Error while reading mother starttime","");
      MessageBase::warning(&this->super_MessageBase,&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p == paVar1) {
        return;
      }
      operator_delete(local_228._M_dataplus._M_p);
      return;
    }
    this->got_mother_starttime = true;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"wtime","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             ::at(&this->walltime_stats,&local_228);
    uVar4 = sysconf(2);
    prmon::monitored_value::set_offset(pmVar3,pVar5.second / uVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  std::ifstream::ifstream(&local_228,"/proc/uptime",_S_in);
  std::istream::_M_extract<float>((float *)&local_228);
  if ((abStack_208[*(long *)(local_228._M_dataplus._M_p + -0x18)] & 5) == 0) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"wtime","");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             ::at(&this->walltime_stats,&local_248);
    prmon::monitored_value::set_value(pmVar3,0);
  }
  else {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Error while reading /proc/uptime","");
    MessageBase::warning(&this->super_MessageBase,&local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(&local_228);
  return;
}

Assistant:

void wallmon::update_stats(const std::vector<pid_t>& pids,
                           const std::string read_path) {
  if (!got_mother_starttime && pids.size() > 0) {
    auto code_and_time = get_mother_starttime(pids[0]);
    if (code_and_time.first) {
      warning("Error while reading mother starttime");
      return;
    } else {
      got_mother_starttime = true;
      walltime_stats.at("wtime").set_offset(code_and_time.second /
                                            sysconf(_SC_CLK_TCK));
    }
  }

  std::ifstream proc_uptime{"/proc/uptime"};
  float uptime_sec{};
  proc_uptime >> uptime_sec;
  if (!proc_uptime) {
    warning("Error while reading /proc/uptime");
    return;
  }

  walltime_stats.at("wtime").set_value(uptime_sec);
}